

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_ssi_filter_module.c
# Opt level: O3

ngx_int_t ngx_http_ssi_evaluate_string
                    (ngx_http_request_t *r,ngx_http_ssi_ctx_t *ctx,ngx_str_t *text,ngx_uint_t flags)

{
  u_char uVar1;
  byte bVar2;
  bool bVar3;
  undefined1 auVar4 [8];
  ngx_pool_t *pnVar5;
  ngx_uint_t nVar6;
  ngx_str_t *pnVar7;
  ngx_http_variable_value_t *pnVar8;
  ngx_buf_t *pnVar9;
  size_t *psVar10;
  undefined8 *puVar11;
  u_char *puVar12;
  void *pvVar13;
  char *fmt;
  ngx_buf_t *pnVar14;
  ngx_buf_t *pnVar15;
  ngx_log_t *log;
  u_char *dst;
  byte *pbVar16;
  long lVar17;
  byte *pbVar18;
  size_t sVar19;
  undefined1 local_a8 [8];
  ngx_array_t lengths;
  ngx_array_t values;
  uint local_48;
  size_t local_40;
  ngx_buf_t *local_38;
  
  nVar6 = ngx_http_script_variables_count((ngx_str_t *)ctx);
  if (nVar6 == 0) {
    pbVar16 = ctx->pos;
    pbVar18 = pbVar16;
    if (((((ulong)text & 1) != 0) && (*pbVar16 != 0x2f)) && (sVar19 = (r->uri).len, sVar19 != 0)) {
      puVar12 = (r->uri).data + sVar19;
      lVar17 = -sVar19;
      do {
        puVar12 = puVar12 + -1;
        if (*puVar12 == '/') {
          pbVar18 = (byte *)ngx_pnalloc(r->pool,(long)ctx->buf - lVar17);
          if (pbVar18 == (byte *)0x0) {
            return -1;
          }
          memcpy(pbVar18,(r->uri).data,-lVar17);
          pbVar16 = pbVar18 + -lVar17;
          break;
        }
        lVar17 = lVar17 + 1;
      } while (lVar17 != 0);
    }
    pnVar15 = ctx->buf;
    if (pnVar15 != (ngx_buf_t *)0x0) {
      bVar3 = false;
      pnVar9 = (ngx_buf_t *)0x0;
      do {
        bVar2 = ctx->pos[(long)pnVar9];
        if (bVar3) {
          if ((0x3a < bVar2 - 0x22) ||
             ((0x400000000000025U >> ((ulong)(bVar2 - 0x22) & 0x3f) & 1) == 0)) {
            *pbVar16 = 0x5c;
            pbVar16 = pbVar16 + 1;
          }
LAB_0015ea5d:
          *pbVar16 = bVar2;
          pbVar16 = pbVar16 + 1;
          pnVar15 = ctx->buf;
          bVar3 = false;
        }
        else {
          bVar3 = true;
          if (bVar2 != 0x5c) goto LAB_0015ea5d;
        }
        pnVar9 = (ngx_buf_t *)((long)&pnVar9->pos + 1);
      } while (pnVar9 < pnVar15);
    }
    ctx->buf = (ngx_buf_t *)(pbVar16 + -(long)pbVar18);
    ctx->pos = pbVar18;
    return 0;
  }
  lengths.nalloc = (ngx_uint_t)r->pool;
  lengths.elts = (void *)0x0;
  lengths.nelts = 8;
  lengths.size = 8;
  local_a8 = (undefined1  [8])ngx_palloc((ngx_pool_t *)lengths.nalloc,0x40);
  if (local_a8 == (undefined1  [8])0x0) {
    return -1;
  }
  values.nalloc = (ngx_uint_t)r->pool;
  values.elts = (void *)0x0;
  values.nelts = 8;
  values.size = 8;
  lengths.pool = (ngx_pool_t *)ngx_palloc((ngx_pool_t *)values.nalloc,0x40);
  if (lengths.pool == (ngx_pool_t *)0x0) {
    return -1;
  }
  local_38 = (ngx_buf_t *)0x0;
  pnVar15 = (ngx_buf_t *)0x0;
  while (pnVar5 = lengths.pool, auVar4 = local_a8, pnVar9 = ctx->buf, pnVar15 < pnVar9) {
    puVar12 = ctx->pos;
    if (puVar12[(long)pnVar15] != '$') {
      pbVar16 = puVar12 + (long)pnVar15;
      bVar3 = false;
      pbVar18 = pbVar16;
      do {
        bVar2 = ctx->pos[(long)pnVar15];
        if (bVar3) {
          if ((0x3a < bVar2 - 0x22) ||
             ((0x400000000000025U >> ((ulong)(bVar2 - 0x22) & 0x3f) & 1) == 0)) {
            *pbVar18 = 0x5c;
            pbVar18 = pbVar18 + 1;
          }
LAB_0015e97f:
          *pbVar18 = bVar2;
          pbVar18 = pbVar18 + 1;
          pnVar9 = ctx->buf;
          bVar3 = false;
        }
        else {
          bVar3 = true;
          if (bVar2 != 0x5c) {
            if (bVar2 != 0x24) goto LAB_0015e97f;
            break;
          }
        }
        pnVar15 = (ngx_buf_t *)((long)&pnVar15->pos + 1);
      } while (pnVar15 < pnVar9);
      sVar19 = (long)pbVar18 - (long)pbVar16;
      goto LAB_0015e99f;
    }
    values.pool = (ngx_pool_t *)0x0;
    pnVar14 = (ngx_buf_t *)((long)&pnVar15->pos + 1);
    if ((pnVar14 == pnVar9) ||
       ((uVar1 = puVar12[(long)pnVar14], uVar1 == '{' &&
        (pnVar14 = (ngx_buf_t *)((long)&pnVar15->pos + 2), pnVar14 == pnVar9)))) {
LAB_0015ea81:
      log = r->connection->log;
      if (log->log_level < 4) {
        return 1;
      }
      fmt = "invalid variable name in \"%V\"";
LAB_0015eb0c:
      ngx_log_error_core(4,log,0,fmt,ctx);
      return 1;
    }
    dst = puVar12 + (long)pnVar14;
    pnVar15 = pnVar14;
    if (pnVar14 < pnVar9) {
      do {
        bVar2 = puVar12[(long)pnVar14];
        if ((uVar1 == '{') && (bVar2 == 0x7d)) {
          pnVar15 = (ngx_buf_t *)((long)&pnVar14->pos + 1);
          goto LAB_0015e8d9;
        }
        if ((0x19 < (byte)((bVar2 & 0xdf) + 0xbf)) &&
           (pnVar15 = pnVar14, bVar2 != 0x5f && 9 < (byte)(bVar2 - 0x30))) break;
        pnVar14 = (ngx_buf_t *)((long)&pnVar14->pos + 1);
        values.pool = (ngx_pool_t *)((long)&((values.pool)->d).last + 1);
        pnVar15 = pnVar9;
      } while (pnVar9 != pnVar14);
    }
    if (uVar1 == '{') {
      log = r->connection->log;
      if (log->log_level < 4) {
        return 1;
      }
      fmt = "the closing bracket in \"%V\" variable is missing";
      ctx = (ngx_http_ssi_ctx_t *)&values.pool;
      goto LAB_0015eb0c;
    }
LAB_0015e8d9:
    if (values.pool == (ngx_pool_t *)0x0) goto LAB_0015ea81;
    nVar6 = ngx_hash_strlow(dst,dst,(size_t)values.pool);
    pnVar7 = ngx_http_ssi_get_variable(r,(ngx_str_t *)&values.pool,nVar6);
    if (pnVar7 != (ngx_str_t *)0x0) {
      sVar19 = pnVar7->len;
      pbVar16 = pnVar7->data;
      goto LAB_0015e99f;
    }
    pnVar8 = ngx_http_get_variable(r,(ngx_str_t *)&values.pool,nVar6);
    if (pnVar8 == (ngx_http_variable_value_t *)0x0) {
      return -1;
    }
    if ((*(uint *)pnVar8 >> 0x1e & 1) == 0) {
      pbVar16 = pnVar8->data;
      sVar19 = (size_t)(*(uint *)pnVar8 & 0xfffffff);
LAB_0015e99f:
      psVar10 = (size_t *)ngx_array_push((ngx_array_t *)local_a8);
      if (psVar10 == (size_t *)0x0) {
        return -1;
      }
      *psVar10 = sVar19;
      puVar11 = (undefined8 *)ngx_array_push((ngx_array_t *)&lengths.pool);
      if (puVar11 == (undefined8 *)0x0) {
        return -1;
      }
      local_38 = (ngx_buf_t *)((long)&local_38->pos + sVar19);
      *puVar11 = pbVar16;
    }
  }
  if ((((ulong)text & 1) != 0) && (values.elts != (void *)0x0)) {
    pvVar13 = (void *)0x0;
    do {
      if (*(long *)((long)local_a8 + (long)pvVar13 * 8) != 0) {
        if ((*(&((lengths.pool)->d).last)[(long)pvVar13] != '/') &&
           (local_40 = (r->uri).len, local_40 != 0)) {
          goto LAB_0015eb87;
        }
        break;
      }
      pvVar13 = (void *)((long)pvVar13 + 1);
    } while (values.elts != pvVar13);
  }
  goto LAB_0015eb97;
  while (local_40 = local_40 - 1, local_40 != 0) {
LAB_0015eb87:
    if (((r->uri).data + -1)[local_40] == '/') {
      local_38 = (ngx_buf_t *)((long)&local_38->pos + local_40);
      goto LAB_0015eba3;
    }
  }
LAB_0015eb97:
  local_40 = 0;
LAB_0015eba3:
  local_48 = (uint)text;
  puVar12 = (u_char *)ngx_pnalloc(r->pool,(long)&local_38->pos + (ulong)((local_48 >> 1 & 1) != 0));
  if (puVar12 == (u_char *)0x0) {
    return -1;
  }
  ctx->buf = local_38;
  ctx->pos = puVar12;
  memcpy(puVar12,(r->uri).data,local_40);
  if (values.elts == (void *)0x0) {
    return 0;
  }
  puVar12 = puVar12 + local_40;
  pvVar13 = (void *)0x0;
  do {
    memcpy(puVar12,(&(pnVar5->d).last)[(long)pvVar13],*(size_t *)((long)auVar4 + (long)pvVar13 * 8))
    ;
    puVar12 = puVar12 + *(long *)((long)auVar4 + (long)pvVar13 * 8);
    pvVar13 = (void *)((long)pvVar13 + 1);
  } while (pvVar13 < values.elts);
  return 0;
}

Assistant:

static ngx_int_t
ngx_http_ssi_evaluate_string(ngx_http_request_t *r, ngx_http_ssi_ctx_t *ctx,
    ngx_str_t *text, ngx_uint_t flags)
{
    u_char                      ch, *p, **value, *data, *part_data;
    size_t                     *size, len, prefix, part_len;
    ngx_str_t                   var, *val;
    ngx_int_t                   key;
    ngx_uint_t                  i, n, bracket, quoted;
    ngx_array_t                 lengths, values;
    ngx_http_variable_value_t  *vv;

    n = ngx_http_script_variables_count(text);

    if (n == 0) {

        data = text->data;
        p = data;

        if ((flags & NGX_HTTP_SSI_ADD_PREFIX) && text->data[0] != '/') {

            for (prefix = r->uri.len; prefix; prefix--) {
                if (r->uri.data[prefix - 1] == '/') {
                    break;
                }
            }

            if (prefix) {
                len = prefix + text->len;

                data = ngx_pnalloc(r->pool, len);
                if (data == NULL) {
                    return NGX_ERROR;
                }

                p = ngx_copy(data, r->uri.data, prefix);
            }
        }

        quoted = 0;

        for (i = 0; i < text->len; i++) {
            ch = text->data[i];

            if (!quoted) {

                if (ch == '\\') {
                    quoted = 1;
                    continue;
                }

            } else {
                quoted = 0;

                if (ch != '\\' && ch != '\'' && ch != '"' && ch != '$') {
                    *p++ = '\\';
                }
            }

            *p++ = ch;
        }

        text->len = p - data;
        text->data = data;

        return NGX_OK;
    }

    if (ngx_array_init(&lengths, r->pool, 8, sizeof(size_t *)) != NGX_OK) {
        return NGX_ERROR;
    }

    if (ngx_array_init(&values, r->pool, 8, sizeof(u_char *)) != NGX_OK) {
        return NGX_ERROR;
    }

    len = 0;
    i = 0;

    while (i < text->len) {

        if (text->data[i] == '$') {

            var.len = 0;

            if (++i == text->len) {
                goto invalid_variable;
            }

            if (text->data[i] == '{') {
                bracket = 1;

                if (++i == text->len) {
                    goto invalid_variable;
                }

                var.data = &text->data[i];

            } else {
                bracket = 0;
                var.data = &text->data[i];
            }

            for ( /* void */ ; i < text->len; i++, var.len++) {
                ch = text->data[i];

                if (ch == '}' && bracket) {
                    i++;
                    bracket = 0;
                    break;
                }

                if ((ch >= 'A' && ch <= 'Z')
                    || (ch >= 'a' && ch <= 'z')
                    || (ch >= '0' && ch <= '9')
                    || ch == '_')
                {
                    continue;
                }

                break;
            }

            if (bracket) {
                ngx_log_error(NGX_LOG_ERR, r->connection->log, 0,
                              "the closing bracket in \"%V\" "
                              "variable is missing", &var);
                return NGX_HTTP_SSI_ERROR;
            }

            if (var.len == 0) {
                goto invalid_variable;
            }

            key = ngx_hash_strlow(var.data, var.data, var.len);

            val = ngx_http_ssi_get_variable(r, &var, key);

            if (val == NULL) {
                vv = ngx_http_get_variable(r, &var, key);
                if (vv == NULL) {
                    return NGX_ERROR;
                }

                if (vv->not_found) {
                    continue;
                }

                part_data = vv->data;
                part_len = vv->len;

            } else {
                part_data = val->data;
                part_len = val->len;
            }

        } else {
            part_data = &text->data[i];
            quoted = 0;

            for (p = part_data; i < text->len; i++) {
                ch = text->data[i];

                if (!quoted) {

                    if (ch == '\\') {
                        quoted = 1;
                        continue;
                    }

                    if (ch == '$') {
                        break;
                    }

                } else {
                    quoted = 0;

                    if (ch != '\\' && ch != '\'' && ch != '"' && ch != '$') {
                        *p++ = '\\';
                    }
                }

                *p++ = ch;
            }

            part_len = p - part_data;
        }

        len += part_len;

        size = ngx_array_push(&lengths);
        if (size == NULL) {
            return NGX_ERROR;
        }

        *size = part_len;

        value = ngx_array_push(&values);
        if (value == NULL) {
            return NGX_ERROR;
        }

        *value = part_data;
    }

    prefix = 0;

    size = lengths.elts;
    value = values.elts;

    if (flags & NGX_HTTP_SSI_ADD_PREFIX) {
        for (i = 0; i < values.nelts; i++) {
            if (size[i] != 0) {
                if (*value[i] != '/') {
                    for (prefix = r->uri.len; prefix; prefix--) {
                        if (r->uri.data[prefix - 1] == '/') {
                            len += prefix;
                            break;
                        }
                    }
                }

                break;
            }
        }
    }

    p = ngx_pnalloc(r->pool, len + ((flags & NGX_HTTP_SSI_ADD_ZERO) ? 1 : 0));
    if (p == NULL) {
        return NGX_ERROR;
    }

    text->len = len;
    text->data = p;

    p = ngx_copy(p, r->uri.data, prefix);

    for (i = 0; i < values.nelts; i++) {
        p = ngx_copy(p, value[i], size[i]);
    }

    return NGX_OK;

invalid_variable:

    ngx_log_error(NGX_LOG_ERR, r->connection->log, 0,
                  "invalid variable name in \"%V\"", text);

    return NGX_HTTP_SSI_ERROR;
}